

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_write(zip_t *zip,void *buf,size_t bufsize)

{
  mz_uint64 *pmVar1;
  tdefl_status tVar2;
  mz_ulong mVar3;
  size_t sVar4;
  
  if (zip == (zip_t *)0x0) {
    return -1;
  }
  if (bufsize != 0 && buf != (void *)0x0) {
    pmVar1 = &(zip->entry).uncomp_size;
    *pmVar1 = *pmVar1 + bufsize;
    mVar3 = mz_crc32((ulong)(zip->entry).uncomp_crc32,(mz_uint8 *)buf,bufsize);
    (zip->entry).uncomp_crc32 = (mz_uint32)mVar3;
    if ((zip->level & 0xf) == 0) {
      sVar4 = (*(zip->archive).m_pWrite)
                        ((zip->archive).m_pIO_opaque,(zip->entry).dir_offset,buf,bufsize);
      if (sVar4 != bufsize) {
        return -8;
      }
      pmVar1 = &(zip->entry).dir_offset;
      *pmVar1 = *pmVar1 + bufsize;
      pmVar1 = &(zip->entry).comp_size;
      *pmVar1 = *pmVar1 + bufsize;
    }
    else {
      tVar2 = tdefl_compress_buffer(&(zip->entry).comp,buf,bufsize,TDEFL_NO_FLUSH);
      if (1 < (uint)tVar2) {
        return -0xc;
      }
    }
  }
  return 0;
}

Assistant:

int zip_entry_write(struct zip_t *zip, const void *buf, size_t bufsize) {
  mz_uint level;
  mz_zip_archive *pzip = NULL;
  tdefl_status status;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (buf && bufsize > 0) {
    zip->entry.uncomp_size += bufsize;
    zip->entry.uncomp_crc32 = (mz_uint32)mz_crc32(
        zip->entry.uncomp_crc32, (const mz_uint8 *)buf, bufsize);

    level = zip->level & 0xF;
    if (!level) {
      if ((pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.dir_offset, buf,
                          bufsize) != bufsize)) {
        // Cannot write buffer
        return ZIP_EWRTENT;
      }
      zip->entry.dir_offset += bufsize;
      zip->entry.comp_size += bufsize;
    } else {
      status = tdefl_compress_buffer(&(zip->entry.comp), buf, bufsize,
                                     TDEFL_NO_FLUSH);
      if (status != TDEFL_STATUS_DONE && status != TDEFL_STATUS_OKAY) {
        // Cannot compress buffer
        return ZIP_ETDEFLBUF;
      }
    }
  }

  return 0;
}